

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_string.c
# Opt level: O0

char * min_expand(MatchState *ms,char *s,char *p,char *ep)

{
  int iVar1;
  char *pcVar2;
  char *in_RCX;
  undefined8 in_RDX;
  ulong in_RSI;
  long in_RDI;
  char *res;
  ulong local_18;
  
  local_18 = in_RSI;
  while( true ) {
    pcVar2 = match((MatchState *)s,p,ep);
    if (pcVar2 != (char *)0x0) {
      return pcVar2;
    }
    if ((*(ulong *)(in_RDI + 8) <= local_18) ||
       (iVar1 = singlematch((int)in_RDX,in_RCX,(char *)0x0), iVar1 == 0)) break;
    local_18 = local_18 + 1;
  }
  return (char *)0x0;
}

Assistant:

static const char *min_expand(MatchState *ms, const char *s,
			      const char *p, const char *ep)
{
  for (;;) {
    const char *res = match(ms, s, ep+1);
    if (res != NULL)
      return res;
    else if (s<ms->src_end && singlematch(uchar(*s), p, ep))
      s++;  /* try with one more repetition */
    else
      return NULL;
  }
}